

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::AutoReg::registerTestCase
          (AutoReg *this,ITestCase *testCase,char *classOrQualifiedMethodName,
          NameAndDesc *nameAndDesc,SourceLineInfo *lineInfo)

{
  IMutableRegistryHub *pIVar1;
  allocator local_19b;
  allocator local_19a;
  allocator local_199;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  TestCase local_118;
  
  pIVar1 = getMutableRegistryHub();
  std::__cxx11::string::string((string *)&local_138,classOrQualifiedMethodName,&local_199);
  extractClassName(&local_158,&local_138);
  std::__cxx11::string::string((string *)&local_178,nameAndDesc->name,&local_19a);
  std::__cxx11::string::string((string *)&local_198,nameAndDesc->description,&local_19b);
  makeTestCase(&local_118,testCase,&local_158,&local_178,&local_198,lineInfo);
  (*pIVar1->_vptr_IMutableRegistryHub[3])(pIVar1,&local_118);
  TestCase::~TestCase(&local_118);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  return;
}

Assistant:

void AutoReg::registerTestCase( ITestCase* testCase,
                                    char const* classOrQualifiedMethodName,
                                    NameAndDesc const& nameAndDesc,
                                    SourceLineInfo const& lineInfo ) {

        getMutableRegistryHub().registerTest
            ( makeTestCase( testCase,
                            extractClassName( classOrQualifiedMethodName ),
                            nameAndDesc.name,
                            nameAndDesc.description,
                            lineInfo ) );
    }